

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O3

void __thiscall Fl_Tree_Item_Array::clear(Fl_Tree_Item_Array *this)

{
  Fl_Tree_Item *this_00;
  Fl_Tree_Item **__ptr;
  long lVar1;
  
  __ptr = this->_items;
  if (__ptr != (Fl_Tree_Item **)0x0) {
    if (0 < this->_total) {
      lVar1 = 0;
      do {
        this_00 = this->_items[lVar1];
        if (this_00 != (Fl_Tree_Item *)0x0) {
          Fl_Tree_Item::~Fl_Tree_Item(this_00);
        }
        operator_delete(this_00,0x88);
        this->_items[lVar1] = (Fl_Tree_Item *)0x0;
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->_total);
      __ptr = this->_items;
    }
    free(__ptr);
    this->_items = (Fl_Tree_Item **)0x0;
  }
  this->_total = 0;
  this->_size = 0;
  return;
}

Assistant:

void Fl_Tree_Item_Array::clear() {
  if ( _items ) {
    for ( int t=0; t<_total; t++ ) {
#if FLTK_ABI_VERSION >= 10303
      if ( _flags & MANAGE_ITEM )
#endif
      {
        delete _items[t];
	_items[t] = 0;
      }
    }
    free((void*)_items); _items = 0;
  }
  _total = _size = 0;
}